

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O2

void __thiscall
ON_LinearWorkflow::ApplyPreProcessGamma(ON_LinearWorkflow *this,ON_4fColor *col,bool for_texture)

{
  char cVar1;
  float *pfVar3;
  undefined7 in_register_00000011;
  uint bCondition;
  float __y;
  float fVar4;
  int iVar2;
  
  if ((int)CONCAT71(in_register_00000011,for_texture) == 0) {
    iVar2 = (*this->_vptr_ON_LinearWorkflow[7])();
    cVar1 = (char)iVar2;
  }
  else {
    iVar2 = (*this->_vptr_ON_LinearWorkflow[5])();
    cVar1 = (char)iVar2;
  }
  if (cVar1 != '\0') {
    (*this->_vptr_ON_LinearWorkflow[0xd])(this);
    if (1e-06 <= ABS(__y + -1.0)) {
      pfVar3 = ON_4fColor::FloatArray(col);
      bCondition = 0;
      if ((0.0 <= *pfVar3) && (0.0 <= pfVar3[1])) {
        bCondition = (uint)(0.0 <= pfVar3[2]);
      }
      ON_REMOVE_ASAP_AssertEx
                (bCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linear_workflow.cpp"
                 ,0xb6,"","(f[0] >= 0.0) && (f[1] >= 0.0) && (f[2] >= 0.0) is false");
      if (0.0 < *pfVar3) {
        fVar4 = powf(*pfVar3,__y);
        *pfVar3 = fVar4;
      }
      if (0.0 < pfVar3[1]) {
        fVar4 = powf(pfVar3[1],__y);
        pfVar3[1] = fVar4;
      }
      if (0.0 < pfVar3[2]) {
        fVar4 = powf(pfVar3[2],__y);
        pfVar3[2] = fVar4;
      }
    }
  }
  return;
}

Assistant:

void ON_LinearWorkflow::ApplyPreProcessGamma(ON_4fColor& col, bool for_texture) const
{
  const bool check = for_texture ? PreProcessTexturesOn() : PreProcessColorsOn();
  if (!check)
    return;

  const float gamma = PreProcessGamma();
  if (!IsFloatEqual(gamma, 1.0f))
  {
    float* f = col.FloatArray();

    ON_ASSERT((f[0] >= 0.0) && (f[1] >= 0.0) && (f[2] >= 0.0));

    if (f[0] > 0.0) f[0] = powf(f[0], gamma);
    if (f[1] > 0.0) f[1] = powf(f[1], gamma);
    if (f[2] > 0.0) f[2] = powf(f[2], gamma);
  }
}